

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_interface.c
# Opt level: O0

int CMConnection_set_character(CMConnection conn,attr_list attrs)

{
  int iVar1;
  undefined8 in_RSI;
  char *in_RDI;
  CManager unaff_retaddr;
  CManager_conflict cm;
  int ret;
  attr_list in_stack_00000060;
  CMConnection in_stack_00000068;
  int line;
  
  line = (int)((ulong)in_RSI >> 0x20);
  IntCManager_lock(unaff_retaddr,in_RDI,line);
  iVar1 = INT_CMConnection_set_character(in_stack_00000068,in_stack_00000060);
  IntCManager_unlock(unaff_retaddr,in_RDI,line);
  return iVar1;
}

Assistant:

extern int
CMConnection_set_character ( CMConnection conn, attr_list attrs )
{
	int ret;
	CManager cm = conn->cm;
	CManager_lock(cm);
	ret = INT_CMConnection_set_character(conn, attrs);
	CManager_unlock(cm);
	return ret;
}